

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

EnumDef * __thiscall flatbuffers::Parser::LookupEnum(Parser *this,string *id)

{
  Namespace *pNVar1;
  pointer pbVar2;
  pointer pbVar3;
  const_iterator cVar4;
  long lVar5;
  Parser *unaff_R12;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined1 local_60 [32];
  pointer local_40;
  _Alloc_hider local_38;
  
  if ((this->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    unaff_R12 = (Parser *)0x0;
  }
  else {
    pNVar1 = this->current_namespace_;
    pbVar2 = (pNVar1->components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (pNVar1->components).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_60._0_8_ = local_60 + 0x10;
    local_60._8_8_ = (char *)0x0;
    local_60[0x10] = '\0';
    lVar6 = (long)pbVar3 - (long)pbVar2;
    bVar8 = lVar6 == 0;
    local_38._M_p = (pointer)this;
    if (!bVar8) {
      lVar6 = lVar6 >> 5;
      lVar7 = lVar6 + (ulong)(lVar6 == 0);
      lVar5 = 8;
      local_40 = pbVar3;
      do {
        std::__cxx11::string::_M_append
                  ((char *)local_60,
                   *(ulong *)((long)(pNVar1->components).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8));
        std::__cxx11::string::push_back((char)(Parser *)local_60);
        lVar5 = lVar5 + 0x20;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      unaff_R12 = (Parser *)local_60;
      if (local_40 != pbVar2) {
        lVar5 = lVar6 * 0x20 + -0x18;
        bVar8 = false;
        do {
          std::__cxx11::string::_M_append((char *)local_60,(ulong)(id->_M_dataplus)._M_p);
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                          *)&this->enums_,(key_type *)local_60);
          if ((_Rb_tree_header *)cVar4._M_node ==
              &(this->enums_).dict._M_t._M_impl.super__Rb_tree_header) {
            unaff_R12 = (Parser *)0x0;
          }
          else {
            unaff_R12 = *(Parser **)(cVar4._M_node + 2);
          }
          if (unaff_R12 != (Parser *)0x0) break;
          std::__cxx11::string::resize
                    ((ulong)local_60,
                     (~(byte)*(undefined8 *)
                              ((long)&(((pNVar1->components).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar5) + (char)local_60._8_8_) -
                     (char)id->_M_string_length);
          lVar5 = lVar5 + -0x20;
          lVar6 = lVar6 + -1;
          bVar8 = lVar6 == 0;
          unaff_R12 = this;
        } while (!bVar8);
      }
    }
    if (bVar8) {
      if ((char *)local_60._8_8_ != (char *)0x0) {
        __assert_fail("full_name.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0xa0,
                      "T *flatbuffers::(anonymous namespace)::LookupTableByName(const SymbolTable<T> &, const std::string &, const Namespace &, size_t) [T = flatbuffers::EnumDef]"
                     );
      }
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                      *)&this->enums_,id);
      if (cVar4._M_node == (_Base_ptr)(local_38._M_p + 0xf8)) {
        unaff_R12 = (Parser *)0x0;
      }
      else {
        unaff_R12 = *(Parser **)(cVar4._M_node + 2);
      }
    }
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,CONCAT71(local_60._17_7_,local_60[0x10]) + 1);
    }
  }
  return (EnumDef *)unaff_R12;
}

Assistant:

EnumDef *Parser::LookupEnum(const std::string &id) {
  // Search thru parent namespaces.
  return LookupTableByName(enums_, id, *current_namespace_, 0);
}